

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O3

REF_STATUS ref_agents_remove(REF_AGENTS ref_agents,REF_INT id)

{
  REF_AGENT_STRUCT *pRVar1;
  int iVar2;
  int iVar3;
  REF_AGENT_STRUCT *pRVar4;
  REF_STATUS RVar5;
  
  RVar5 = 3;
  if ((-1 < id) && (id < ref_agents->max)) {
    pRVar4 = ref_agents->agent;
    if (pRVar4[(uint)id].mode != REF_AGENT_UNUSED) {
      pRVar1 = pRVar4 + (uint)id;
      iVar2 = pRVar1->previous;
      if (ref_agents->last == id) {
        ref_agents->last = iVar2;
      }
      iVar3 = pRVar1->next;
      if (iVar2 != -1) {
        pRVar4[iVar2].next = iVar3;
      }
      if (iVar3 != -1) {
        pRVar4[iVar3].previous = iVar2;
      }
      pRVar1->mode = REF_AGENT_UNUSED;
      pRVar4[(uint)id].previous = -1;
      pRVar4[(uint)id].next = ref_agents->blank;
      ref_agents->blank = id;
      ref_agents->n = ref_agents->n + -1;
      RVar5 = 0;
    }
  }
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_agents_remove(REF_AGENTS ref_agents, REF_INT id) {
  if (id < 0 || ref_agents_max(ref_agents) <= id) return REF_INVALID;
  if (!ref_agent_valid(ref_agents, id)) return REF_INVALID;

  if (ref_agents->last == id)
    ref_agents->last = ref_agent_previous(ref_agents, id);

  if (REF_EMPTY != ref_agent_previous(ref_agents, id))
    ref_agent_next(ref_agents, ref_agent_previous(ref_agents, id)) =
        ref_agent_next(ref_agents, id);

  if (REF_EMPTY != ref_agent_next(ref_agents, id))
    ref_agent_previous(ref_agents, ref_agent_next(ref_agents, id)) =
        ref_agent_previous(ref_agents, id);

  ref_agent_mode(ref_agents, id) = REF_AGENT_UNUSED;
  ref_agent_previous(ref_agents, id) = REF_EMPTY;
  ref_agent_next(ref_agents, id) = ref_agents->blank;
  ref_agents->blank = id;

  ref_agents_n(ref_agents)--;

  return REF_SUCCESS;
}